

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

shared_ptr<vera::BVH> __thiscall
vera::BVH::hit(BVH *this,Ray *_ray,float *_minDistance,float *_maxDistance)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  float *in_R8;
  shared_ptr<vera::BVH> sVar5;
  shared_ptr<vera::BVH> right_hit;
  shared_ptr<vera::BVH> left_hit;
  float right_maxT;
  float right_minT;
  float left_maxT;
  float left_minT;
  undefined1 local_69;
  _func_int **local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined8 local_48;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  local_48 = *(undefined8 *)(_ray + 0x18);
  local_58 = *(undefined1 (*) [8])(_ray + 8);
  p_Stack_50 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(_ray + 0x10);
  bVar3 = intersection((Ray *)_minDistance,(BoundingBox *)local_58,_maxDistance,in_R8);
  if (bVar3) {
    if (_ray[0x60] == (Ray)0x0) {
      local_2c = *_maxDistance;
      local_30 = *in_R8;
      (**(code **)(**(long **)(_ray + 0x38) + 0x18))(local_58,*(long **)(_ray + 0x38),_minDistance);
      local_34 = *_maxDistance;
      local_38 = *in_R8;
      (**(code **)(**(long **)(_ray + 0x48) + 0x18))(&local_68,*(long **)(_ray + 0x48),_minDistance)
      ;
      p_Var2 = p_Stack_50;
      p_Var1 = local_60;
      if ((local_58 == (undefined1  [8])0x0) || (local_68 == (_func_int **)0x0)) {
        _Var4._M_pi = extraout_RDX_01;
        if (local_58 == (undefined1  [8])0x0) {
          if (local_68 == (_func_int **)0x0) {
            this->_vptr_BVH = (_func_int **)0x0;
            (this->super_BoundingBox).min.field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
            (this->super_BoundingBox).min.field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
          }
          else {
            this->_vptr_BVH = local_68;
            (this->super_BoundingBox).min.field_0 =
                 (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
            (this->super_BoundingBox).min.field_1 =
                 (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
            local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_BoundingBox).min =
                 p_Var1;
            local_68 = (_func_int **)0x0;
          }
        }
        else {
          this->_vptr_BVH = (_func_int **)local_58;
          (this->super_BoundingBox).min.field_0 =
               (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
          (this->super_BoundingBox).min.field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_BoundingBox).min = p_Var2;
          local_58 = (undefined1  [8])0x0;
        }
      }
      else {
        this->_vptr_BVH = (_func_int **)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<vera::BVH,std::allocator<vera::BVH>,vera::BVH&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->super_BoundingBox,
                   (BVH **)this,(allocator<vera::BVH> *)&local_69,(BVH *)_ray);
        _Var4._M_pi = extraout_RDX_02;
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        _Var4._M_pi = extraout_RDX_03;
      }
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
        _Var4._M_pi = extraout_RDX_04;
      }
    }
    else {
      this->_vptr_BVH = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<vera::BVH,std::allocator<vera::BVH>,vera::BVH&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->super_BoundingBox,(BVH **)this
                 ,(allocator<vera::BVH> *)local_58,(BVH *)_ray);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  else {
    this->_vptr_BVH = (_func_int **)0x0;
    (this->super_BoundingBox).min.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (this->super_BoundingBox).min.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<vera::BVH>)sVar5.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BVH> BVH::hit(const Ray& _ray, float& _minDistance, float& _maxDistance) {
    if ( !intersection(_ray, (BoundingBox)*this, _minDistance, _maxDistance) )
        return nullptr;

    if (!leaf) {
        float left_minT = _minDistance;
        float left_maxT = _maxDistance;
        std::shared_ptr<BVH> left_hit = left->hit(_ray, left_minT, left_maxT);

        float right_minT = _minDistance;
        float right_maxT = _maxDistance;
        std::shared_ptr<BVH> right_hit = right->hit(_ray, right_minT, right_maxT);

        if (left_hit != nullptr && right_hit != nullptr)
            return std::make_shared<BVH>( *this );
        else if (left_hit != nullptr) 
            return left_hit;
        else if (right_hit != nullptr)
            return right_hit;

        return nullptr;
    }
    else
        return std::make_shared<BVH>( *this );
}